

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeHolder::growBuffer(CodeHolder *this,CodeBuffer *cb,size_t n)

{
  Error EVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->_cgAsm != (Assembler *)0x0) {
    (*(this->_cgAsm->super_CodeEmitter)._vptr_CodeEmitter[0x10])();
  }
  uVar5 = n + cb->_length;
  EVar1 = 1;
  if (!CARRY8(n,cb->_length)) {
    uVar4 = cb->_capacity;
    if (uVar4 < uVar5) {
      if (cb->_isFixedSize == false) {
        uVar2 = uVar4 + 0x20;
        if (uVar4 < 0x1fa0) {
          uVar2 = 0x1fa0;
        }
        while( true ) {
          uVar4 = uVar2 + 0x800000;
          if (uVar2 < 0x800000) {
            uVar4 = uVar2 * 2;
          }
          uVar3 = uVar4 + 0x800000;
          if (uVar4 < 0x800000) {
            uVar3 = uVar4 * 2;
          }
          if (uVar3 < uVar2) break;
          uVar2 = uVar3;
          if (uVar5 <= uVar3 - 0x20) {
            EVar1 = CodeHolder_reserveInternal(this,cb,uVar3 - 0x20);
            return EVar1;
          }
        }
      }
      else {
        EVar1 = 0xb;
      }
    }
    else {
      EVar1 = 0;
    }
  }
  return EVar1;
}

Assistant:

Error CodeHolder::growBuffer(CodeBuffer* cb, size_t n) noexcept {
  // This is most likely called by `Assembler` so `sync()` shouldn't be needed,
  // however, if this is called by the user and the currently attached Assembler
  // did generate some code we could lose that, so sync now and make sure the
  // section length is updated.
  if (_cgAsm) _cgAsm->sync();

  // Now the length of the section must be valid.
  size_t length = cb->getLength();
  if (ASMJIT_UNLIKELY(n > IntTraits<uintptr_t>::maxValue() - length))
    return DebugUtils::errored(kErrorNoHeapMemory);

  // We can now check if growing the buffer is really necessary. It's unlikely
  // that this function is called while there is still room for `n` bytes.
  size_t capacity = cb->getCapacity();
  size_t required = cb->getLength() + n;
  if (ASMJIT_UNLIKELY(required <= capacity)) return kErrorOk;

  if (cb->isFixedSize())
    return DebugUtils::errored(kErrorCodeTooLarge);

  if (capacity < 8096)
    capacity = 8096;
  else
    capacity += Globals::kAllocOverhead;

  do {
    size_t old = capacity;
    if (capacity < Globals::kAllocThreshold)
      capacity *= 2;
    else
      capacity += Globals::kAllocThreshold;

    if (capacity < Globals::kAllocThreshold)
      capacity *= 2;
    else
      capacity += Globals::kAllocThreshold;

    // Overflow.
    if (ASMJIT_UNLIKELY(old > capacity))
      return DebugUtils::errored(kErrorNoHeapMemory);
  } while (capacity - Globals::kAllocOverhead < required);

  return CodeHolder_reserveInternal(this, cb, capacity - Globals::kAllocOverhead);
}